

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

FilenamePattern *
duckdb::FilenamePattern::Deserialize
          (FilenamePattern *__return_storage_ptr__,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  idx_t iVar4;
  
  (__return_storage_ptr__->base)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->base).field_2
  ;
  *(undefined4 *)&(__return_storage_ptr__->base).field_2 = 0x61746164;
  *(undefined2 *)((long)&(__return_storage_ptr__->base).field_2 + 4) = 0x5f;
  (__return_storage_ptr__->base)._M_string_length = 5;
  __return_storage_ptr__->pos = 5;
  __return_storage_ptr__->uuid = false;
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"base");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005c42c3;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005c42c3;
  }
  operator_delete(local_50);
LAB_005c42c3:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"pos");
  if ((char)uVar2 == '\0') {
    iVar4 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar4 = CONCAT44(extraout_var,iVar3);
  }
  __return_storage_ptr__->pos = iVar4;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"uuid");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->uuid = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  return __return_storage_ptr__;
}

Assistant:

FilenamePattern FilenamePattern::Deserialize(Deserializer &deserializer) {
	FilenamePattern result;
	deserializer.ReadPropertyWithDefault<string>(200, "base", result.base);
	deserializer.ReadPropertyWithDefault<idx_t>(201, "pos", result.pos);
	deserializer.ReadPropertyWithDefault<bool>(202, "uuid", result.uuid);
	return result;
}